

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# huffman_tree.cpp
# Opt level: O3

void __thiscall
HuffTree::add_code(HuffTree *this,char data,vector<bool,_std::allocator<bool>_> *code)

{
  uint uVar1;
  TreeNode *pTVar2;
  pointer __p;
  undefined8 *puVar3;
  uint uVar4;
  default_delete<HuffTree::TreeNode> *pdVar5;
  _Head_base<0UL,_HuffTree::TreeNode_*,_false> _Var6;
  unique_ptr<HuffTree::TreeNode,_std::default_delete<HuffTree::TreeNode>_> *puVar7;
  undefined7 in_register_00000031;
  ulong *puVar8;
  int iVar9;
  ulong uVar10;
  ulong *puVar11;
  TreeNode *local_70;
  undefined4 local_68;
  undefined4 uStack_64;
  undefined4 uStack_60;
  undefined4 uStack_5c;
  undefined4 local_58;
  undefined4 uStack_54;
  undefined8 uStack_50;
  undefined4 local_3c;
  ulong *local_38;
  
  local_3c = (undefined4)CONCAT71(in_register_00000031,data);
  _Var6._M_head_impl =
       (this->root)._M_t.
       super___uniq_ptr_impl<HuffTree::TreeNode,_std::default_delete<HuffTree::TreeNode>_>._M_t.
       super__Tuple_impl<0UL,_HuffTree::TreeNode_*,_std::default_delete<HuffTree::TreeNode>_>.
       super__Head_base<0UL,_HuffTree::TreeNode_*,_false>._M_head_impl;
  this->curr_node = _Var6._M_head_impl;
  puVar11 = (code->super__Bvector_base<std::allocator<bool>_>)._M_impl.super__Bvector_impl_data.
            _M_start.super__Bit_iterator_base._M_p;
  puVar8 = (code->super__Bvector_base<std::allocator<bool>_>)._M_impl.super__Bvector_impl_data.
           _M_finish.super__Bit_iterator_base._M_p;
  uVar1 = (code->super__Bvector_base<std::allocator<bool>_>)._M_impl.super__Bvector_impl_data.
          _M_finish.super__Bit_iterator_base._M_offset;
  if (uVar1 != 0 || puVar11 != puVar8) {
    uVar10 = 0;
    local_38 = puVar8;
    do {
      if ((*puVar11 >> (uVar10 & 0x3f) & 1) == 0) {
        if ((tuple<HuffTree::TreeNode_*,_std::default_delete<HuffTree::TreeNode>_>)
            *(tuple<HuffTree::TreeNode_*,_std::default_delete<HuffTree::TreeNode>_> *)
             &((_Var6._M_head_impl)->_left)._M_t ==
            (__uniq_ptr_impl<HuffTree::TreeNode,_std::default_delete<HuffTree::TreeNode>_>)0x0) {
          (_Var6._M_head_impl)->_is_leaf = false;
          local_68 = 0x20;
          uStack_64 = 0;
          uStack_60 = 0;
          uStack_5c = 0;
          local_58 = 0;
          uStack_54 = 0;
          uStack_50 = 1;
          puVar3 = (undefined8 *)operator_new(0x20);
          pdVar5 = (default_delete<HuffTree::TreeNode> *)&(_Var6._M_head_impl)->_left;
          *puVar3 = CONCAT44(uStack_64,local_68);
          puVar3[1] = 0;
          uStack_60 = 0;
          uStack_5c = 0;
          puVar3[2] = 0;
          local_58 = 0;
          uStack_54 = 0;
          *(undefined1 *)(puVar3 + 3) = 1;
          local_70 = (TreeNode *)0x0;
          pTVar2 = *(TreeNode **)pdVar5;
          *(undefined8 **)pdVar5 = puVar3;
          if (pTVar2 != (TreeNode *)0x0) {
            std::default_delete<HuffTree::TreeNode>::operator()(pdVar5,pTVar2);
            if (local_70 != (TreeNode *)0x0) {
              std::default_delete<HuffTree::TreeNode>::operator()
                        ((default_delete<HuffTree::TreeNode> *)&local_70,local_70);
            }
          }
          local_70 = (TreeNode *)0x0;
          if ((TreeNode *)CONCAT44(uStack_54,local_58) != (TreeNode *)0x0) {
            std::default_delete<HuffTree::TreeNode>::operator()
                      ((default_delete<HuffTree::TreeNode> *)&local_58,
                       (TreeNode *)CONCAT44(uStack_54,local_58));
          }
          local_58 = 0;
          uStack_54 = 0;
          if ((TreeNode *)CONCAT44(uStack_5c,uStack_60) != (TreeNode *)0x0) {
            std::default_delete<HuffTree::TreeNode>::operator()
                      ((default_delete<HuffTree::TreeNode> *)&uStack_60,
                       (TreeNode *)CONCAT44(uStack_5c,uStack_60));
          }
          _Var6._M_head_impl = this->curr_node;
          puVar8 = local_38;
        }
        puVar7 = &(_Var6._M_head_impl)->_left;
      }
      else {
        if ((tuple<HuffTree::TreeNode_*,_std::default_delete<HuffTree::TreeNode>_>)
            *(tuple<HuffTree::TreeNode_*,_std::default_delete<HuffTree::TreeNode>_> *)
             &((_Var6._M_head_impl)->_right)._M_t ==
            (__uniq_ptr_impl<HuffTree::TreeNode,_std::default_delete<HuffTree::TreeNode>_>)0x0) {
          (_Var6._M_head_impl)->_is_leaf = false;
          local_68 = 0x20;
          uStack_64 = 0;
          uStack_60 = 0;
          uStack_5c = 0;
          local_58 = 0;
          uStack_54 = 0;
          uStack_50 = 1;
          puVar3 = (undefined8 *)operator_new(0x20);
          pdVar5 = (default_delete<HuffTree::TreeNode> *)&(_Var6._M_head_impl)->_right;
          *puVar3 = CONCAT44(uStack_64,local_68);
          puVar3[1] = 0;
          uStack_60 = 0;
          uStack_5c = 0;
          puVar3[2] = 0;
          local_58 = 0;
          uStack_54 = 0;
          *(undefined1 *)(puVar3 + 3) = 1;
          local_70 = (TreeNode *)0x0;
          pTVar2 = *(TreeNode **)pdVar5;
          *(undefined8 **)pdVar5 = puVar3;
          if (pTVar2 != (TreeNode *)0x0) {
            std::default_delete<HuffTree::TreeNode>::operator()(pdVar5,pTVar2);
            if (local_70 != (TreeNode *)0x0) {
              std::default_delete<HuffTree::TreeNode>::operator()
                        ((default_delete<HuffTree::TreeNode> *)&local_70,local_70);
            }
          }
          local_70 = (TreeNode *)0x0;
          if ((TreeNode *)CONCAT44(uStack_54,local_58) != (TreeNode *)0x0) {
            std::default_delete<HuffTree::TreeNode>::operator()
                      ((default_delete<HuffTree::TreeNode> *)&local_58,
                       (TreeNode *)CONCAT44(uStack_54,local_58));
          }
          local_58 = 0;
          uStack_54 = 0;
          if ((TreeNode *)CONCAT44(uStack_5c,uStack_60) != (TreeNode *)0x0) {
            std::default_delete<HuffTree::TreeNode>::operator()
                      ((default_delete<HuffTree::TreeNode> *)&uStack_60,
                       (TreeNode *)CONCAT44(uStack_5c,uStack_60));
          }
          _Var6._M_head_impl = this->curr_node;
          puVar8 = local_38;
        }
        puVar7 = &(_Var6._M_head_impl)->_right;
      }
      _Var6._M_head_impl =
           (puVar7->_M_t).
           super___uniq_ptr_impl<HuffTree::TreeNode,_std::default_delete<HuffTree::TreeNode>_>._M_t.
           super__Tuple_impl<0UL,_HuffTree::TreeNode_*,_std::default_delete<HuffTree::TreeNode>_>.
           super__Head_base<0UL,_HuffTree::TreeNode_*,_false>._M_head_impl;
      this->curr_node = _Var6._M_head_impl;
      iVar9 = (int)uVar10;
      puVar11 = puVar11 + (iVar9 == 0x3f);
      uVar4 = iVar9 + 1;
      if (iVar9 == 0x3f) {
        uVar4 = 0;
      }
      uVar10 = (ulong)uVar4;
    } while (uVar4 != uVar1 || puVar11 != puVar8);
  }
  (_Var6._M_head_impl)->_data = (char)local_3c;
  (_Var6._M_head_impl)->_is_leaf = true;
  return;
}

Assistant:

void HuffTree::add_code(char data, std::vector<bool> code) {
    back_to_root();
    for (bool bit : code) {
        if (bit) {
            if (!curr_node->_right) {
                curr_node->_is_leaf = false;
                curr_node->_right = std::make_unique<TreeNode>(TreeNode());
            }
            curr_node = curr_node->_right.get();
        } else {
            if (!curr_node->_left) {
                curr_node->_is_leaf = false;
                curr_node->_left = std::make_unique<TreeNode>(TreeNode());
            }
            curr_node = curr_node->_left.get();
        }
    }
    curr_node->_data = data;
    curr_node->_is_leaf = true;
}